

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

void testing::internal::ReportInvalidTestCaseType(char *test_case_name,char *file,int line)

{
  FILE *__stream;
  _Alloc_hider _Var1;
  int in_ECX;
  size_t sVar2;
  char *pcVar3;
  ostream *poVar4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  string local_60;
  string local_40;
  
  Message::Message((Message *)&local_68);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_68.ptr_ + 0x10),"Attempted redefinition of test case ",0x24);
  poVar4 = (ostream *)(local_68.ptr_ + 0x10);
  if (test_case_name == (char *)0x0) {
    sVar2 = 6;
    pcVar3 = "(null)";
  }
  else {
    sVar2 = strlen(test_case_name);
    pcVar3 = test_case_name;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_68.ptr_ + 0x10),".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_68.ptr_ + 0x10),
             "All tests in the same test case must use the same test fixture\n",0x3f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_68.ptr_ + 0x10),"class.  However, in test case ",0x1e);
  poVar4 = (ostream *)(local_68.ptr_ + 0x10);
  if (test_case_name == (char *)0x0) {
    sVar2 = 6;
    test_case_name = "(null)";
  }
  else {
    sVar2 = strlen(test_case_name);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,test_case_name,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_68.ptr_ + 0x10),", you tried\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_68.ptr_ + 0x10),
             "to define a test using a fixture class different from the one\n",0x3e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_68.ptr_ + 0x10),
             "used earlier. This can happen if the two fixture classes are\n",0x3d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_68.ptr_ + 0x10),
             "from different namespaces and have the same name. You should\n",0x3d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_68.ptr_ + 0x10),
             "probably rename one of the classes to put the tests into different\n",0x43);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_68.ptr_ + 0x10),"test cases.",0xb);
  __stream = _stderr;
  FormatFileLocation_abi_cxx11_(&local_60,(internal *)file,(char *)(ulong)(uint)line,in_ECX);
  _Var1._M_p = local_60._M_dataplus._M_p;
  StringStreamToString(&local_40,local_68.ptr_);
  fprintf(__stream,"%s %s",_Var1._M_p,local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_68.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_68.ptr_ + 8))();
  }
  return;
}

Assistant:

void ReportInvalidTestCaseType(const char* test_case_name,
                               const char* file, int line) {
  Message errors;
  errors
      << "Attempted redefinition of test case " << test_case_name << ".\n"
      << "All tests in the same test case must use the same test fixture\n"
      << "class.  However, in test case " << test_case_name << ", you tried\n"
      << "to define a test using a fixture class different from the one\n"
      << "used earlier. This can happen if the two fixture classes are\n"
      << "from different namespaces and have the same name. You should\n"
      << "probably rename one of the classes to put the tests into different\n"
      << "test cases.";

  fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
          errors.GetString().c_str());
}